

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,std::error_code_const&,unsigned_long)>>,std::error_code,unsigned_long>,std::allocator<void>>
               (impl_base *base,bool call)

{
  _func_void_impl_base_ptr_bool *bytes_transferred;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  error_code ec;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_a1;
  undefined1 local_a0 [56];
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _func_void_impl_base_ptr_bool *local_48;
  error_category *peStack_40;
  _func_void_impl_base_ptr_bool *local_38;
  ptr local_30;
  
  local_30.a = &local_a1;
  local_a0._0_8_ = base[1].complete_;
  local_a0._8_8_ = base[2].complete_;
  local_a0._16_8_ = base[3].complete_;
  local_a0._24_8_ = base[4].complete_;
  local_a0._32_4_ = *(undefined4 *)&base[5].complete_;
  local_a0._40_8_ = base[6].complete_;
  local_a0._48_8_ = base[7].complete_;
  local_68 = (element_type *)base[8].complete_;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[9].complete_;
  base[9].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[8].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_58 = (element_type *)base[10].complete_;
  this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0xb].complete_;
  base[0xb].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[10].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_48 = base[0xc].complete_;
  peStack_40 = (error_category *)base[0xd].complete_;
  bytes_transferred = base[0xe].complete_;
  local_50._M_pi = this._M_pi;
  local_38 = bytes_transferred;
  local_30.v = base;
  local_30.p = (impl<asio::detail::binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  if (call) {
    ec._0_8_ = (ulong)local_48 & 0xffffffff;
    ec._M_cat = peStack_40;
    read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
    ::operator()((read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
                  *)local_a0,ec,(size_t)bytes_transferred,0);
    this._M_pi = local_50._M_pi;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  impl<asio::detail::binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }